

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O0

void Amap_CreateRulesTwo(Amap_Lib_t *p,Vec_Int_t *vNods,Vec_Int_t *vNods0,Vec_Int_t *vNods1,int fXor
                        )

{
  int iVar1;
  int iVar2;
  int iNod1;
  int iNod0;
  int iNod;
  int k;
  int i;
  int fXor_local;
  Vec_Int_t *vNods1_local;
  Vec_Int_t *vNods0_local;
  Vec_Int_t *vNods_local;
  Amap_Lib_t *p_local;
  
  for (iNod = 0; iVar1 = Vec_IntSize(vNods0), iNod < iVar1; iNod = iNod + 1) {
    iVar1 = Vec_IntEntry(vNods0,iNod);
    for (iNod0 = 0; iVar2 = Vec_IntSize(vNods1), iNod0 < iVar2; iNod0 = iNod0 + 1) {
      iVar2 = Vec_IntEntry(vNods1,iNod0);
      iNod1 = Amap_LibFindNode(p,iVar1,iVar2,fXor);
      if (iNod1 == -1) {
        iNod1 = Amap_LibCreateNode(p,iVar1,iVar2,fXor);
      }
      iVar2 = Abc_Var2Lit(iNod1,0);
      Vec_IntPushUnique(vNods,iVar2);
    }
  }
  return;
}

Assistant:

void Amap_CreateRulesTwo( Amap_Lib_t * p, Vec_Int_t * vNods, Vec_Int_t * vNods0, Vec_Int_t * vNods1, int fXor )
{
    int i, k, iNod, iNod0, iNod1;
    Vec_IntForEachEntry( vNods0, iNod0, i )
    Vec_IntForEachEntry( vNods1, iNod1, k )
    {
        iNod = Amap_LibFindNode( p, iNod0, iNod1, fXor );
        if ( iNod == -1 )
            iNod = Amap_LibCreateNode( p, iNod0, iNod1, fXor );
        Vec_IntPushUnique( vNods, Abc_Var2Lit(iNod, 0) );
    }
}